

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O1

__uint128_t * kmer_reverse128(__uint128_t *__return_storage_ptr__,__uint128_t kmer,uint8_t k)

{
  __uint128_t *p_Var1;
  int in_EDX;
  undefined7 in_register_00000031;
  ulong uVar2;
  uint uVar3;
  
  uVar2 = CONCAT71(in_register_00000031,k);
  p_Var1 = (__uint128_t *)0x0;
  if (in_EDX != 0) {
    do {
      uVar3 = (uint)__return_storage_ptr__;
      __return_storage_ptr__ = (__uint128_t *)((ulong)__return_storage_ptr__ >> 2 | uVar2 << 0x3e);
      uVar2 = uVar2 >> 2;
      p_Var1 = (__uint128_t *)((ulong)(uVar3 & 3) + (long)p_Var1 * 4 ^ 3);
      in_EDX = in_EDX + -1;
    } while (in_EDX != 0);
  }
  return p_Var1;
}

Assistant:

__uint128_t kmer_reverse128(__uint128_t kmer, uint8_t k) {
    __uint128_t old_kmer=kmer;
    __uint128_t rkmer=0;
    for (int pos=0;pos<k;++pos) {
        __uint128_t nuc=3-(old_kmer%4);
        old_kmer>>=2;
        rkmer<<=2;
        rkmer+=nuc;
    }
    return rkmer;
}